

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O2

size_t __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::
get_block_index_index_for_index
          (ImplicitProducer *this,index_t index,BlockIndexHeader **localBlockIndex)

{
  BlockIndexHeader *pBVar1;
  __int_type _Var2;
  
  pBVar1 = (this->blockIndex)._M_b._M_p;
  *localBlockIndex = pBVar1;
  _Var2 = (pBVar1->tail).super___atomic_base<unsigned_long>._M_i;
  return (*localBlockIndex)->capacity - 1 &
         _Var2 + ((index & 0xffffffffffffffe0) -
                  ((*localBlockIndex)->index[_Var2]->key).super___atomic_base<unsigned_long>._M_i >>
                 5);
}

Assistant:

inline size_t get_block_index_index_for_index(index_t index, BlockIndexHeader*& localBlockIndex) const
        {
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
            debug::DebugLock lock(mutex);
#endif
            index &= ~static_cast<index_t>(BLOCK_SIZE - 1);
            localBlockIndex = blockIndex.load(std::memory_order_acquire);
            auto tail = localBlockIndex->tail.load(std::memory_order_acquire);
            auto tailBase = localBlockIndex->index[tail]->key.load(std::memory_order_relaxed);
            assert(tailBase != INVALID_BLOCK_BASE);
            // Note: Must use division instead of shift because the index may wrap around, causing a negative
            // offset, whose negativity we want to preserve
            auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(index - tailBase) / BLOCK_SIZE);
            size_t idx = (tail + offset) & (localBlockIndex->capacity - 1);
            assert(localBlockIndex->index[idx]->key.load(std::memory_order_relaxed) == index && localBlockIndex->index[idx]->value.load(std::memory_order_relaxed) != nullptr);
            return idx;
        }